

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline(Convolution_x86 *this,Option *opt)

{
  _func_int *p_Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  bool bVar12;
  int *piVar13;
  Allocator *pAVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  undefined8 uVar18;
  long *plVar19;
  undefined8 uVar20;
  bool bVar21;
  bool bVar22;
  Layer *pLVar23;
  int i;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  undefined8 *puVar30;
  long lVar31;
  int j_4;
  uint _h;
  int iVar32;
  long lVar33;
  undefined4 *puVar34;
  uint uVar35;
  long lVar36;
  int iVar37;
  void *pvVar38;
  int k;
  int iVar39;
  _func_int **pp_Var40;
  int k_6;
  ulong uVar41;
  long lVar42;
  int k_3;
  int j_5;
  ulong uVar43;
  _func_int **pp_Var44;
  int i_7;
  long lVar45;
  _func_int **pp_Var46;
  long lVar47;
  undefined4 *puVar48;
  int j;
  void **ppvVar49;
  undefined4 *puVar50;
  _func_int *p_Var51;
  _func_int **pp_Var52;
  byte bVar53;
  byte bVar54;
  float fVar55;
  float fVar56;
  ulong local_190;
  ParamDict pd;
  uint uStack_174;
  int local_170;
  Allocator *local_168;
  int iStack_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int local_150 [2];
  size_t local_148 [2];
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 local_128;
  undefined8 local_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 local_108;
  undefined8 local_100;
  Mat *local_f0;
  ParamDict pd_5;
  long local_a0;
  ModelBinFromMatArray local_88;
  long local_78;
  void *local_70;
  undefined8 local_68;
  long local_60;
  long local_58;
  void *local_50;
  long local_48;
  long local_40;
  _func_int **local_38;
  
  pp_Var40 = this->_vptr_Convolution_x86;
  p_Var51 = pp_Var40[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var51) != 0) {
    return 0;
  }
  switch(*(undefined4 *)((long)&(this->weight_winograd43_data).allocator + (long)(p_Var51 + 4))) {
  case 1:
    pLVar23 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar23->_vptr_Layer[2])(pLVar23,&pd);
    break;
  case 2:
    pLVar23 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var51));
    (*pLVar23->_vptr_Layer[2])(pLVar23,&pd);
    break;
  case 3:
    pLVar23 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var51));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var51) + 4));
    (*pLVar23->_vptr_Layer[2])(pLVar23,&pd);
    break;
  case 4:
    pLVar23 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar23->_vptr_Layer[2])(pLVar23,&pd);
    break;
  case 5:
    pLVar23 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar23->_vptr_Layer[2])(pLVar23,&pd);
    break;
  case 6:
    pLVar23 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var51));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var51) + 4));
    (*pLVar23->_vptr_Layer[2])(pLVar23,&pd);
    break;
  default:
    pLVar23 = (Layer *)0x0;
    goto LAB_001890ed;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar23->_vptr_Layer[4])(pLVar23,opt);
  pp_Var40 = this->_vptr_Convolution_x86;
LAB_001890ed:
  this->activation = pLVar23;
  p_Var51 = pp_Var40[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var51) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  iVar32 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var51);
  iVar37 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51);
  uVar43 = (long)*(int *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var51) /
           (long)(iVar37 * iVar32);
  uVar35 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
  uVar25 = (ulong)(int)uVar35;
  uVar43 = (long)((ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 | uVar43 & 0xffffffff) /
           (long)(int)uVar35;
  uVar26 = uVar43 & 0xffffffff;
  bVar12 = opt->use_packing_layout;
  if ((((iVar32 == iVar37 && bVar12 == false) &&
       (iVar24 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51), iVar24 != 1))
      && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == iVar24)) &&
     ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1 &&
      (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)))) {
    pLVar23 = create_layer(6);
    this->convolution_dilation1 = pLVar23;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).h +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).d +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).c +
                           (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elempack +
                                   (long)this->_vptr_Convolution_x86[-3]));
    ParamDict::set(&pd_5,6,*(int *)(&(this->weight_winograd43_data).field_0x1c +
                                   (long)this->_vptr_Convolution_x86[-3]));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var40 = this->_vptr_Convolution_x86;
    if (*(int *)((long)&(this->weight_winograd43_data).elempack + (long)pp_Var40[-3]) == 0) {
      local_148[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_174 = 0;
      local_170 = 0;
      local_168 = (Allocator *)0x0;
      iStack_160 = 0;
      iStack_15c = 0;
      iStack_158 = 0;
      iStack_154 = 0;
      local_150[0] = 0;
      p_Var51 = pp_Var40[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var51)) {
        piVar13 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var51);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
        uVar18 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var51);
        pd.d._0_4_ = (undefined4)uVar18;
        pd.d._4_4_ = (undefined4)((ulong)uVar18 >> 0x20);
        uStack_174 = (uint)((ulong)*(undefined8 *)
                                    ((long)&(this->weight_winograd63_data).cstep + (long)p_Var51) >>
                           0x20);
        local_170 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var51);
        local_168 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var51);
        uVar18 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var51);
        uVar20 = *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var51);
        iStack_160 = (int)uVar18;
        iStack_15c = (int)((ulong)uVar18 >> 0x20);
        iStack_158 = (int)uVar20;
        iStack_154 = (int)((ulong)uVar20 >> 0x20);
        local_150[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var51);
        local_148[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var51);
      }
      pLVar23 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_88,(Mat *)&pd);
      (*pLVar23->_vptr_Layer[3])(pLVar23,&local_88);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_88);
      piVar13 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          if (local_168 == (Allocator *)0x0) {
            free(pd._vptr_ParamDict);
          }
          else {
            (*local_168->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_148[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_174 = 0;
      local_170 = 0;
      local_168 = (Allocator *)0x0;
      iStack_160 = 0;
      iStack_15c = 0;
      iStack_158 = 0;
      iStack_154 = 0;
      local_150[0] = 0;
      p_Var51 = pp_Var40[-3];
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var51)) {
        piVar13 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var51);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
        uVar18 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var51);
        pd.d._0_4_ = (undefined4)uVar18;
        pd.d._4_4_ = (undefined4)((ulong)uVar18 >> 0x20);
        uStack_174 = (uint)((ulong)*(undefined8 *)
                                    ((long)&(this->weight_winograd63_data).cstep + (long)p_Var51) >>
                           0x20);
        local_170 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var51);
        local_168 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var51);
        iStack_160 = *(int *)((long)&(this->scale_in_data).refcount + (long)p_Var51);
        iStack_15c = *(int *)((long)&(this->scale_in_data).refcount + (long)(p_Var51 + 4));
        iStack_158 = *(int *)((long)&(this->scale_in_data).elemsize + (long)p_Var51);
        iStack_154 = *(int *)((long)&(this->scale_in_data).elemsize + (long)(p_Var51 + 4));
        local_150[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var51);
        local_148[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var51);
        p_Var51 = this->_vptr_Convolution_x86[-3];
      }
      local_100 = 0;
      local_108 = 0;
      uStack_10c = 0;
      uStack_110 = 0;
      uStack_114 = 0;
      uStack_118 = 0;
      local_120 = 0;
      local_128 = 0;
      uStack_12c = 0;
      local_130 = 0;
      uStack_134 = 0;
      uStack_138 = 0;
      local_148[1] = 0;
      if ((_func_int *)(local_148 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).dims + (long)p_Var51)) {
        piVar13 = *(int **)((long)&(this->scale_in_data).h + (long)p_Var51);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        local_148[1] = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var51);
        uVar18 = *(undefined8 *)((long)&(this->scale_in_data).h + (long)p_Var51);
        uStack_138 = (undefined4)uVar18;
        uStack_134 = (undefined4)((ulong)uVar18 >> 0x20);
        uVar18 = *(undefined8 *)((long)&(this->scale_in_data).c + (long)p_Var51);
        local_130 = (undefined4)uVar18;
        uStack_12c = (undefined4)((ulong)uVar18 >> 0x20);
        local_128 = *(undefined4 *)((long)&(this->scale_in_data).cstep + (long)p_Var51);
        local_120 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var51);
        uStack_118 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var51);
        uStack_114 = (undefined4)
                     ((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var51) >> 0x20);
        uStack_110 = (undefined4)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var51);
        uStack_10c = (undefined4)
                     ((ulong)*(undefined8 *)(&this->field_0x1d8 + (long)p_Var51) >> 0x20);
        local_108 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var51);
        local_100 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var51);
      }
      pLVar23 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_88,(Mat *)&pd);
      (*pLVar23->_vptr_Layer[3])(pLVar23,&local_88);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_88);
      lVar33 = 0x48;
      do {
        piVar13 = *(int **)((long)&pd.d + lVar33);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (*(long **)((long)&local_168 + lVar33) == (long *)0x0) {
              free(*(void **)((long)&pd._vptr_ParamDict + lVar33));
            }
            else {
              (**(code **)(**(long **)((long)&local_168 + lVar33) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_148 + lVar33) = 0;
        *(undefined8 *)((long)&pd.d + lVar33 + 4) = 0;
        *(undefined8 *)((long)&uStack_174 + lVar33) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar33) = 0;
        *(undefined8 *)((long)&pd.d + lVar33) = 0;
        *(undefined4 *)((long)local_150 + lVar33) = 0;
        *(undefined8 *)((long)&iStack_160 + lVar33) = 0;
        *(undefined8 *)((long)&iStack_158 + lVar33) = 0;
        lVar33 = lVar33 + -0x48;
      } while (lVar33 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var51 = this->_vptr_Convolution_x86[-3];
      piVar13 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var51);
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          plVar19 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var51);
          if (plVar19 == (long *)0x0) {
            free(*(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var51));
          }
          else {
            (**(code **)(*plVar19 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var51) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var51) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var51 + 4)) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var51) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var51) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var51) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var51) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var51) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  _h = (uint)uVar43;
  lVar33 = (long)(int)_h;
  if (bVar12 == false) {
    bVar21 = false;
    goto LAB_001899e9;
  }
  bVar53 = (uVar43 & 3) == 0;
  bVar54 = (uVar25 & 3) != 0;
  bVar21 = (bool)bVar53;
  if (((_h | uVar35) & 3) != 0) goto LAB_001893a7;
  if (((iVar37 == 1 && iVar32 == 1) &&
      (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1)) &&
     (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1 &&
       ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1 &&
        (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)))) ||
      ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1 &&
       ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 2 &&
        (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 2)))))))) {
    iVar32 = 1;
    iVar37 = iVar32;
LAB_001899b1:
    convolution_im2col_sgemm_transform_kernel_pack4_sse
              ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var51),
               &this->weight_sgemm_data,_h,uVar35,iVar32,iVar37);
LAB_001899e9:
    bVar54 = bVar12 ^ 1;
    bVar53 = bVar12;
  }
  else {
    if (opt->use_winograd_convolution != true) {
LAB_0018991f:
      iVar24 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51);
      if (iVar24 == 1) {
        iVar24 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51);
        if (iVar24 == 1) {
          if ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)) {
            bVar22 = false;
            if ((0xb < (int)uVar35) || (bVar22 = false, 0xb < (int)_h)) goto LAB_00189992;
          }
          if (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4))) ||
              (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51))) &&
             ((bVar22 = false, 0xf < (int)uVar35 || (0xf < (int)_h)))) goto LAB_00189992;
        }
        else {
LAB_00189979:
          if (1 < iVar24) goto LAB_0018997e;
        }
      }
      else {
        if (iVar24 < 2) {
          iVar24 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51);
          goto LAB_00189979;
        }
LAB_0018997e:
        bVar22 = (int)uVar35 < 0x10 && (int)_h < 0x10;
LAB_00189992:
        if ((opt->use_sgemm_convolution == true) && (!bVar22)) goto LAB_001899b1;
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var51),
                 &this->weight_data_tm,_h,uVar35,iVar32,iVar37,4,4);
      goto LAB_001899e9;
    }
    bVar22 = opt->use_winograd23_convolution;
    if ((bVar22 != false) || (opt->use_winograd43_convolution != false)) {
      if (iVar37 == 3 && iVar32 == 3) goto LAB_001896a9;
      goto LAB_0018991f;
    }
    if (((iVar37 != 3) || (iVar32 != 3)) || (opt->use_winograd63_convolution == false))
    goto LAB_0018991f;
LAB_001896a9:
    if (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) != 1) ||
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) != 1)) ||
       ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) != 1 ||
        (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) != 1))))
    goto LAB_0018991f;
    local_190 = uVar26;
    if ((((opt->use_winograd63_convolution == true) && (7 < (int)_h)) && (uVar35 - 8 < 0x19)) &&
       (_h < 0x21)) {
LAB_0018b399:
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      uVar41 = 0;
      Mat::create((Mat *)&pd_5,0x40,_h,uVar35,4,(Allocator *)0x0);
      local_f0 = &this->weight_winograd63_data;
      uVar26 = 0;
      if (0 < (int)_h) {
        uVar26 = uVar43 & 0xffffffff;
      }
      uVar43 = 0;
      if (0 < (int)uVar35) {
        uVar43 = (ulong)uVar35;
      }
      for (; pp_Var40 = pd_5._vptr_ParamDict, uVar41 != uVar43; uVar41 = uVar41 + 1) {
        lVar36 = (long)(int)(_h * 9 * (int)uVar41) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
        for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
          lVar29 = uVar28 * 0x24;
          fVar2 = *(float *)(lVar36 + 0x18 + lVar29);
          fVar3 = *(float *)(lVar36 + 0x1c + lVar29);
          fVar4 = *(float *)(lVar36 + 0x20 + lVar29);
          fVar5 = *(float *)(lVar36 + 0x10 + lVar29);
          fVar6 = *(float *)(lVar36 + lVar29);
          fVar7 = *(float *)(lVar36 + 4 + lVar29);
          fVar8 = *(float *)(lVar36 + 8 + lVar29);
          fVar9 = *(float *)(lVar36 + 0xc + lVar29);
          fVar10 = *(float *)(lVar36 + 0x14 + lVar29);
          for (lVar29 = 8; lVar29 != 0x68; lVar29 = lVar29 + 0xc) {
            fVar11 = *(float *)((long)&DAT_004c6660 + lVar29);
            fVar55 = (float)*(undefined8 *)(&UNK_004c6658 + lVar29);
            fVar56 = (float)((ulong)*(undefined8 *)(&UNK_004c6658 + lVar29) >> 0x20);
            *(ulong *)((long)&local_190 + lVar29) =
                 CONCAT44(fVar11 * fVar10 + fVar56 * fVar5 + fVar55 * fVar9,
                          fVar11 * fVar8 + fVar55 * fVar6 + fVar56 * fVar7);
            *(float *)((long)&pd._vptr_ParamDict + lVar29) =
                 fVar11 * fVar4 + fVar55 * fVar2 + fVar56 * fVar3;
          }
          pp_Var44 = pp_Var40;
          for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
            fVar2 = *(float *)((long)&pd._vptr_ParamDict + lVar29 * 0xc);
            uVar18 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar29 * 0xc + 4);
            puVar30 = &DAT_004c6664;
            for (lVar45 = 0; lVar45 != 8; lVar45 = lVar45 + 1) {
              *(float *)((long)pp_Var44 + lVar45 * 4) =
                   (float)((ulong)*puVar30 >> 0x20) * (float)((ulong)uVar18 >> 0x20) +
                   *(float *)((long)puVar30 + -4) * fVar2 + (float)*puVar30 * (float)uVar18;
              puVar30 = (undefined8 *)((long)puVar30 + 0xc);
            }
            pp_Var44 = pp_Var44 + 4;
          }
        }
      }
      Mat::create(local_f0,(int)_h / 4,0x40,(int)uVar35 / 4,0x40,0x10,(Allocator *)0x0);
      iVar32 = (this->weight_winograd63_data).w;
      pvVar15 = (this->weight_winograd63_data).data;
      sVar16 = (this->weight_winograd63_data).elemsize;
      sVar17 = (this->weight_winograd63_data).cstep;
      for (uVar43 = 0; (long)(uVar43 | 3) < (long)uVar25; uVar43 = uVar43 + 4) {
        lVar36 = 0;
        for (lVar29 = 0; lVar29 != 0x40; lVar29 = lVar29 + 1) {
          lVar45 = (long)pvVar15 + (long)iVar32 * sVar16 * lVar29 + (uVar43 >> 2) * sVar17 * sVar16;
          for (uVar26 = 0; (long)(uVar26 | 3) < lVar33; uVar26 = uVar26 + 4) {
            for (lVar42 = 0; lVar42 != 4; lVar42 = lVar42 + 1) {
              for (lVar47 = 0; lVar47 != 0x10; lVar47 = lVar47 + 4) {
                *(undefined4 *)(lVar45 + lVar47) =
                     *(undefined4 *)(lVar36 + (long)pd_5._vptr_ParamDict);
              }
              lVar45 = lVar45 + 0x10;
            }
          }
          lVar36 = lVar36 + 4;
        }
      }
      piVar13 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      uVar26 = local_190;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        pp_Var40 = pd_5._vptr_ParamDict;
        if (*piVar13 == 0) {
LAB_0018bb97:
          free(pp_Var40);
          uVar26 = local_190;
        }
      }
    }
    else {
      if (opt->use_winograd43_convolution == false) {
        if (bVar22 == false) goto LAB_0018b399;
      }
      else if (((bVar22 | opt->use_winograd63_convolution) != 1) || (7 < (int)uVar35 && 7 < (int)_h)
              ) {
        local_148[0] = 0;
        pd._vptr_ParamDict = (_func_int **)0x0;
        pd.d._0_4_ = 0;
        pd.d._4_4_ = 0;
        uStack_174 = 0;
        local_170 = 0;
        local_168 = (Allocator *)0x0;
        iStack_160 = 0;
        iStack_15c = 0;
        iStack_158 = 0;
        iStack_154 = 0;
        local_150[0] = 0;
        uVar41 = 0;
        Mat::create((Mat *)&pd,0x24,_h,uVar35,4,(Allocator *)0x0);
        uVar26 = 0;
        if (0 < (int)_h) {
          uVar26 = uVar43 & 0xffffffff;
        }
        uVar43 = 0;
        if (0 < (int)uVar35) {
          uVar43 = (ulong)uVar35;
        }
        for (; uVar41 != uVar43; uVar41 = uVar41 + 1) {
          lVar36 = (long)(int)(_h * 9 * (int)uVar41) * 4 +
                   *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
          pp_Var40 = (_func_int **)
                     (((ulong)uStack_174 << 0x20) * local_148[0] * uVar41 + (long)pd._vptr_ParamDict
                     );
          for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
            lVar29 = uVar28 * 0x24;
            fVar2 = *(float *)(lVar36 + 0x18 + lVar29);
            fVar3 = *(float *)(lVar36 + 0x1c + lVar29);
            fVar4 = *(float *)(lVar36 + 0x20 + lVar29);
            fVar5 = *(float *)(lVar36 + 0x10 + lVar29);
            fVar6 = *(float *)(lVar36 + lVar29);
            fVar7 = *(float *)(lVar36 + 4 + lVar29);
            fVar8 = *(float *)(lVar36 + 8 + lVar29);
            fVar9 = *(float *)(lVar36 + 0xc + lVar29);
            fVar10 = *(float *)(lVar36 + 0x14 + lVar29);
            for (lVar29 = 8; lVar29 != 0x50; lVar29 = lVar29 + 0xc) {
              fVar11 = *(float *)((long)&DAT_004c66c0 + lVar29);
              fVar55 = (float)*(undefined8 *)(&UNK_004c66b8 + lVar29);
              fVar56 = (float)((ulong)*(undefined8 *)(&UNK_004c66b8 + lVar29) >> 0x20);
              *(ulong *)((long)&local_f0 + lVar29) =
                   CONCAT44(fVar11 * fVar10 + fVar56 * fVar5 + fVar55 * fVar9,
                            fVar11 * fVar8 + fVar55 * fVar6 + fVar56 * fVar7);
              *(float *)((long)&pd_5._vptr_ParamDict + lVar29) =
                   fVar11 * fVar4 + fVar55 * fVar2 + fVar56 * fVar3;
            }
            pp_Var44 = pp_Var40;
            for (lVar29 = 0; lVar29 != 6; lVar29 = lVar29 + 1) {
              fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc);
              uVar18 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc + 4);
              puVar30 = &DAT_004c66c4;
              for (lVar45 = 0; lVar45 != 6; lVar45 = lVar45 + 1) {
                *(float *)((long)pp_Var44 + lVar45 * 4) =
                     (float)((ulong)*puVar30 >> 0x20) * (float)((ulong)uVar18 >> 0x20) +
                     *(float *)((long)puVar30 + -4) * fVar2 + (float)*puVar30 * (float)uVar18;
                puVar30 = (undefined8 *)((long)puVar30 + 0xc);
              }
              pp_Var44 = pp_Var44 + 3;
            }
            pp_Var40 = (_func_int **)
                       ((long)pp_Var40 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
          }
        }
        Mat::create(&this->weight_winograd43_data,
                    (int)((long)((ulong)(uint)((int)local_190 >> 0x1f) << 0x20 |
                                local_190 & 0xffffffff) / 4),0x24,(int)uVar35 / 4,0x40,0x10,
                    (Allocator *)0x0);
        iVar32 = (this->weight_winograd43_data).w;
        pvVar15 = (this->weight_winograd43_data).data;
        sVar16 = (this->weight_winograd43_data).elemsize;
        sVar17 = (this->weight_winograd43_data).cstep;
        for (uVar43 = 0; (long)(uVar43 | 3) < (long)uVar25; uVar43 = uVar43 + 4) {
          lVar36 = 0;
          for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
            lVar45 = (long)pvVar15 +
                     (long)iVar32 * sVar16 * lVar29 + (uVar43 >> 2) * sVar17 * sVar16;
            lVar42 = local_148[0] * ((ulong)uStack_174 << 0x20);
            puVar50 = (undefined4 *)(lVar42 * uVar43 + lVar36 + (long)pd._vptr_ParamDict);
            lVar47 = (long)iStack_15c * ((ulong)uStack_174 << 0x20);
            for (uVar26 = 0; (long)(uVar26 | 3) < lVar33; uVar26 = uVar26 + 4) {
              puVar34 = puVar50;
              for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
                puVar48 = puVar34;
                for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 4) {
                  *(undefined4 *)(lVar45 + lVar31) = *puVar48;
                  puVar48 = (undefined4 *)((long)puVar48 + lVar42);
                }
                puVar34 = (undefined4 *)((long)puVar34 + lVar47);
                lVar45 = lVar45 + 0x10;
              }
              puVar50 = puVar50 + lVar47;
            }
            lVar36 = lVar36 + 4;
          }
        }
        piVar13 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
        uVar26 = local_190;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            if (local_168 == (Allocator *)0x0) {
              free(pd._vptr_ParamDict);
              uVar26 = local_190;
            }
            else {
              (*local_168->_vptr_Allocator[3])();
              uVar26 = local_190;
            }
          }
        }
        goto LAB_001893a7;
      }
      local_148[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      uStack_174 = 0;
      local_170 = 0;
      local_168 = (Allocator *)0x0;
      iStack_160 = 0;
      iStack_15c = 0;
      iStack_158 = 0;
      iStack_154 = 0;
      local_150[0] = 0;
      uVar41 = 0;
      Mat::create((Mat *)&pd,0x10,_h,uVar35,4,(Allocator *)0x0);
      uVar26 = 0;
      if (0 < (int)_h) {
        uVar26 = uVar43 & 0xffffffff;
      }
      uVar43 = 0;
      if (0 < (int)uVar35) {
        uVar43 = (ulong)uVar35;
      }
      for (; uVar41 != uVar43; uVar41 = uVar41 + 1) {
        lVar36 = (long)(int)(_h * 9 * (int)uVar41) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
        pp_Var40 = (_func_int **)
                   (((ulong)uStack_174 << 0x20) * local_148[0] * uVar41 + (long)pd._vptr_ParamDict);
        for (uVar28 = 0; uVar28 != uVar26; uVar28 = uVar28 + 1) {
          lVar29 = uVar28 * 0x24;
          fVar2 = *(float *)(lVar36 + 0x18 + lVar29);
          fVar3 = *(float *)(lVar36 + 0x1c + lVar29);
          fVar4 = *(float *)(lVar36 + 0x20 + lVar29);
          fVar5 = *(float *)(lVar36 + 0x10 + lVar29);
          fVar6 = *(float *)(lVar36 + lVar29);
          fVar7 = *(float *)(lVar36 + 4 + lVar29);
          fVar8 = *(float *)(lVar36 + 8 + lVar29);
          fVar9 = *(float *)(lVar36 + 0xc + lVar29);
          fVar10 = *(float *)(lVar36 + 0x14 + lVar29);
          for (lVar29 = 8; lVar29 != 0x38; lVar29 = lVar29 + 0xc) {
            fVar11 = *(float *)((long)&DAT_004c6710 + lVar29);
            fVar55 = (float)*(undefined8 *)(&UNK_004c6708 + lVar29);
            fVar56 = (float)((ulong)*(undefined8 *)(&UNK_004c6708 + lVar29) >> 0x20);
            *(ulong *)((long)&local_f0 + lVar29) =
                 CONCAT44(fVar11 * fVar10 + fVar56 * fVar5 + fVar55 * fVar9,
                          fVar11 * fVar8 + fVar55 * fVar6 + fVar56 * fVar7);
            *(float *)((long)&pd_5._vptr_ParamDict + lVar29) =
                 fVar11 * fVar4 + fVar55 * fVar2 + fVar56 * fVar3;
          }
          pp_Var44 = pp_Var40;
          for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
            fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc);
            uVar18 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc + 4);
            puVar30 = &DAT_004c6714;
            for (lVar45 = 0; lVar45 != 4; lVar45 = lVar45 + 1) {
              *(float *)((long)pp_Var44 + lVar45 * 4) =
                   (float)((ulong)*puVar30 >> 0x20) * (float)((ulong)uVar18 >> 0x20) +
                   *(float *)((long)puVar30 + -4) * fVar2 + (float)*puVar30 * (float)uVar18;
              puVar30 = (undefined8 *)((long)puVar30 + 0xc);
            }
            pp_Var44 = pp_Var44 + 2;
          }
          pp_Var40 = (_func_int **)((long)pp_Var40 + (long)iStack_15c * ((ulong)uStack_174 << 0x20))
          ;
        }
      }
      Mat::create(&this->weight_winograd23_data,
                  (int)((long)((ulong)(uint)((int)local_190 >> 0x1f) << 0x20 |
                              local_190 & 0xffffffff) / 4),0x10,(int)uVar35 / 4,0x40,0x10,
                  (Allocator *)0x0);
      iVar32 = (this->weight_winograd23_data).w;
      pvVar15 = (this->weight_winograd23_data).data;
      sVar16 = (this->weight_winograd23_data).elemsize;
      sVar17 = (this->weight_winograd23_data).cstep;
      for (uVar43 = 0; (long)(uVar43 | 3) < (long)uVar25; uVar43 = uVar43 + 4) {
        lVar36 = 0;
        for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
          lVar45 = (long)pvVar15 + (long)iVar32 * sVar16 * lVar29 + (uVar43 >> 2) * sVar17 * sVar16;
          lVar42 = local_148[0] * ((ulong)uStack_174 << 0x20);
          puVar50 = (undefined4 *)(lVar42 * uVar43 + lVar36 + (long)pd._vptr_ParamDict);
          lVar47 = (long)iStack_15c * ((ulong)uStack_174 << 0x20);
          for (uVar26 = 0; (long)(uVar26 | 3) < lVar33; uVar26 = uVar26 + 4) {
            puVar34 = puVar50;
            for (lVar27 = 0; lVar27 != 4; lVar27 = lVar27 + 1) {
              puVar48 = puVar34;
              for (lVar31 = 0; lVar31 != 0x10; lVar31 = lVar31 + 4) {
                *(undefined4 *)(lVar45 + lVar31) = *puVar48;
                puVar48 = (undefined4 *)((long)puVar48 + lVar42);
              }
              puVar34 = (undefined4 *)((long)puVar34 + lVar47);
              lVar45 = lVar45 + 0x10;
            }
            puVar50 = puVar50 + lVar47;
          }
          lVar36 = lVar36 + 4;
        }
      }
      piVar13 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      uVar26 = local_190;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        if (*piVar13 == 0) {
          pp_Var40 = pd._vptr_ParamDict;
          if (local_168 == (Allocator *)0x0) goto LAB_0018bb97;
          (*local_168->_vptr_Allocator[3])();
          uVar26 = local_190;
        }
      }
    }
LAB_001893a7:
    if (((uVar25 & 3) == 0) && (iVar32 = (int)uVar26, (uVar26 & 3) != 0)) {
      p_Var51 = this->_vptr_Convolution_x86[-3];
      iVar37 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var51);
      if (iVar37 == 3) {
        if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51) != 3) ||
           (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) != 1)) &&
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) != 2 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) != 2))))))))
        goto LAB_001895b0;
        iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
        iVar37 = 3;
        iVar39 = iVar37;
      }
      else {
        if (((iVar37 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 2)))))) {
          iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
          iVar37 = 1;
          iVar39 = iVar37;
LAB_0018964d:
          convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var51),
                     &this->weight_sgemm_data,iVar32,iVar24,iVar37,iVar39);
          goto LAB_0018a29d;
        }
LAB_001895b0:
        iVar24 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51);
        if (iVar24 == 1) {
          iVar24 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51);
          if (iVar24 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)) &&
                ((0xb < iVar32 ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51))) &&
                ((0xf < iVar32 ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51)))))))
            goto LAB_00189618;
          }
          else {
LAB_0018960e:
            if (1 < iVar24) goto LAB_00189613;
          }
        }
        else {
          if (iVar24 < 2) {
            iVar24 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51);
            goto LAB_0018960e;
          }
LAB_00189613:
          if (iVar32 < 0x10) {
            bVar12 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51) < 0x10;
          }
          else {
LAB_00189618:
            bVar12 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar12)) {
            iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
            iVar39 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51);
            goto LAB_0018964d;
          }
        }
        iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
        iVar39 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51);
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var51),
                 &this->weight_data_tm,iVar32,iVar24,iVar37,iVar39,1,4);
      goto LAB_0018a29d;
    }
  }
  uVar18 = local_68;
  if ((bVar54 != 0) && (bVar21)) {
    p_Var51 = this->_vptr_Convolution_x86[-3];
    iVar32 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var51);
    iVar37 = (int)uVar26;
    if (((iVar32 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51) == 1))
       && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)) ||
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 2)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 2)))))) {
      iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
      iVar32 = 1;
      iVar39 = iVar32;
LAB_00189dd6:
      convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var51),
                 &this->weight_sgemm_data,iVar37,iVar24,iVar32,iVar39);
      uVar18 = local_68;
    }
    else if (((opt->use_winograd_convolution == true) && (iVar32 == 3)) &&
            (((opt->use_winograd63_convolution != false &&
              (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51) == 3 &&
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1)) &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1)))) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)))))) {
      uVar35 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
      pd_5._vptr_ParamDict = (_func_int **)0x0;
      pd_5.d._0_4_ = 0;
      pd_5.d._4_4_ = 0;
      uVar25 = 0;
      Mat::create((Mat *)&pd_5,0x40,iVar37,uVar35,4,(Allocator *)0x0);
      local_f0 = &this->weight_winograd63_data;
      local_78 = (long)(int)uVar35;
      uVar43 = 0;
      if (0 < iVar37) {
        uVar43 = uVar26 & 0xffffffff;
      }
      uVar41 = 0;
      if (0 < (int)uVar35) {
        uVar41 = (ulong)uVar35;
      }
      for (; pp_Var40 = pd_5._vptr_ParamDict, uVar25 != uVar41; uVar25 = uVar25 + 1) {
        lVar36 = (long)(iVar37 * 9 * (int)uVar25) * 4 +
                 *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
        for (uVar28 = 0; uVar28 != uVar43; uVar28 = uVar28 + 1) {
          lVar29 = uVar28 * 0x24;
          fVar2 = *(float *)(lVar36 + 0x18 + lVar29);
          fVar3 = *(float *)(lVar36 + 0x1c + lVar29);
          fVar4 = *(float *)(lVar36 + 0x20 + lVar29);
          fVar5 = *(float *)(lVar36 + 0x10 + lVar29);
          fVar6 = *(float *)(lVar36 + lVar29);
          fVar7 = *(float *)(lVar36 + 4 + lVar29);
          fVar8 = *(float *)(lVar36 + 8 + lVar29);
          fVar9 = *(float *)(lVar36 + 0xc + lVar29);
          fVar10 = *(float *)(lVar36 + 0x14 + lVar29);
          for (lVar29 = 8; lVar29 != 0x68; lVar29 = lVar29 + 0xc) {
            fVar11 = *(float *)((long)&DAT_004c6660 + lVar29);
            fVar55 = (float)*(undefined8 *)(&UNK_004c6658 + lVar29);
            fVar56 = (float)((ulong)*(undefined8 *)(&UNK_004c6658 + lVar29) >> 0x20);
            *(ulong *)((long)&local_190 + lVar29) =
                 CONCAT44(fVar11 * fVar10 + fVar56 * fVar5 + fVar55 * fVar9,
                          fVar11 * fVar8 + fVar55 * fVar6 + fVar56 * fVar7);
            *(float *)((long)&pd._vptr_ParamDict + lVar29) =
                 fVar11 * fVar4 + fVar55 * fVar2 + fVar56 * fVar3;
          }
          pp_Var44 = pp_Var40;
          for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
            fVar2 = *(float *)((long)&pd._vptr_ParamDict + lVar29 * 0xc);
            uVar18 = *(undefined8 *)((long)&pd._vptr_ParamDict + lVar29 * 0xc + 4);
            puVar30 = &DAT_004c6664;
            for (lVar45 = 0; lVar45 != 8; lVar45 = lVar45 + 1) {
              *(float *)((long)pp_Var44 + lVar45 * 4) =
                   (float)((ulong)*puVar30 >> 0x20) * (float)((ulong)uVar18 >> 0x20) +
                   *(float *)((long)puVar30 + -4) * fVar2 + (float)*puVar30 * (float)uVar18;
              puVar30 = (undefined8 *)((long)puVar30 + 0xc);
            }
            pp_Var44 = pp_Var44 + 4;
          }
        }
      }
      local_190 = uVar26;
      Mat::create(local_f0,iVar37,0x40,((int)uVar35 / 4) * -3 + uVar35,0x10,4,(Allocator *)0x0);
      sVar16 = (this->weight_winograd63_data).elemsize;
      local_60 = (this->weight_winograd63_data).cstep * sVar16;
      local_58 = (long)(this->weight_winograd63_data).w * sVar16;
      local_38 = pd_5._vptr_ParamDict;
      local_68 = 0;
      local_70 = (this->weight_winograd63_data).data;
      local_a0 = 0;
      for (uVar43 = 0; (long)(uVar43 | 3) < local_78; uVar43 = uVar43 + 4) {
        local_50 = (void *)((uVar43 >> 2) * local_60 + (long)local_70);
        lVar36 = 0;
        lVar29 = local_a0;
        while (lVar42 = lVar29, lVar45 = lVar36, lVar45 != 0x40) {
          puVar50 = (undefined4 *)(local_58 * lVar45 + (long)local_50);
          for (lVar36 = 3; lVar36 < lVar33; lVar36 = lVar36 + 4) {
            *puVar50 = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[1] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[2] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[3] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[4] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[5] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[6] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[7] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[8] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[9] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[10] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[0xb] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[0xc] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[0xd] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[0xe] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50[0xf] = *(undefined4 *)((long)pd_5._vptr_ParamDict + lVar42);
            puVar50 = puVar50 + 0x10;
          }
          lVar29 = lVar42 + 4;
          local_48 = lVar45;
          local_40 = lVar42;
          lVar36 = lVar45 + 1;
        }
      }
      iVar32 = (this->weight_winograd63_data).w;
      local_f0 = (Mat *)(this->weight_winograd63_data).data;
      sVar16 = (this->weight_winograd63_data).elemsize;
      sVar17 = (this->weight_winograd63_data).cstep;
      uVar26 = uVar43 & 0xffffffff;
      for (; (long)uVar43 < local_78; uVar43 = uVar43 + 1) {
        ppvVar49 = (void **)((long)&local_f0->data +
                            (ulong)(((uint)uVar26 & 3) + (int)(uVar26 >> 2)) * sVar17 * sVar16);
        pp_Var40 = pd_5._vptr_ParamDict;
        pp_Var44 = pd_5._vptr_ParamDict;
        pp_Var46 = pd_5._vptr_ParamDict;
        pp_Var52 = pd_5._vptr_ParamDict;
        for (lVar36 = 0; lVar29 = 3, lVar36 != 0x40; lVar36 = lVar36 + 1) {
          for (; lVar29 < lVar33; lVar29 = lVar29 + 4) {
            *(undefined4 *)((long)ppvVar49 + lVar29 * 4 + -0xc) = *(undefined4 *)pp_Var44;
            *(undefined4 *)((long)ppvVar49 + lVar29 * 4 + -8) = *(undefined4 *)pp_Var46;
            *(undefined4 *)((long)ppvVar49 + lVar29 * 4 + -4) = *(undefined4 *)pp_Var40;
            *(undefined4 *)((long)ppvVar49 + lVar29 * 4) = *(undefined4 *)pp_Var52;
          }
          pp_Var40 = (_func_int **)((long)pp_Var40 + 4);
          pp_Var46 = (_func_int **)((long)pp_Var46 + 4);
          pp_Var44 = (_func_int **)((long)pp_Var44 + 4);
          pp_Var52 = (_func_int **)((long)pp_Var52 + 4);
          ppvVar49 = (void **)((long)ppvVar49 + (long)iVar32 * sVar16);
        }
        uVar26 = (ulong)((uint)uVar26 + 1);
      }
      piVar13 = (int *)CONCAT44(pd_5.d._4_4_,pd_5.d._0_4_);
      uVar26 = local_190;
      uVar18 = 0;
      if (piVar13 != (int *)0x0) {
        LOCK();
        *piVar13 = *piVar13 + -1;
        UNLOCK();
        uVar18 = local_68;
        if (*piVar13 == 0) {
          local_68 = 0;
          free(pd_5._vptr_ParamDict);
          uVar26 = local_190;
          uVar18 = local_68;
        }
      }
    }
    else {
      iVar24 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51);
      if (iVar24 == 1) {
        iVar24 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51);
        if (iVar24 == 1) {
          if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1)
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)) &&
              ((0xb < iVar37 ||
               (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51))))) ||
             (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) ||
               (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51))) &&
              ((0xf < iVar37 ||
               (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51)))))))
          goto LAB_00189d9f;
        }
        else {
LAB_00189d95:
          if (1 < iVar24) goto LAB_00189d9a;
        }
      }
      else {
        if (iVar24 < 2) {
          iVar24 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51);
          goto LAB_00189d95;
        }
LAB_00189d9a:
        if (iVar37 < 0x10) {
          bVar12 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51) < 0x10;
        }
        else {
LAB_00189d9f:
          bVar12 = false;
        }
        if ((opt->use_sgemm_convolution == true) && (!bVar12)) {
          iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
          iVar39 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51);
          goto LAB_00189dd6;
        }
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var51),
                 &this->weight_data_tm,iVar37,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51),iVar32,
                 *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51),4,1);
      uVar18 = local_68;
    }
  }
  local_68 = uVar18;
  if ((bVar54 & (bVar53 ^ 1)) != 1) goto LAB_0018a29d;
  p_Var51 = this->_vptr_Convolution_x86[-3];
  iVar32 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var51);
  iVar37 = (int)uVar26;
  if (((iVar32 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51) == 1)) &&
     (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1 &&
       (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1)) &&
        (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)))) ||
      ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1)) &&
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 2)) &&
       (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 2)))))) {
    iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
    iVar39 = 1;
    iVar32 = iVar39;
  }
  else {
    if (opt->use_winograd_convolution == true) {
      bVar12 = opt->use_winograd23_convolution;
      if (bVar12 == false) {
        if ((iVar32 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_00189ee4;
      }
      else if (iVar32 == 3) {
LAB_00189ee4:
        if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51) == 3) &&
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var51) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var51) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var51 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var51) == 1)))) {
          uVar35 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
          lVar33 = (long)(int)uVar35;
          local_190 = uVar26;
          if ((opt->use_winograd43_convolution == true) && (0xf < iVar37)) {
            if (((int)uVar35 < 0x10 & bVar12) != 0) goto LAB_0018a843;
LAB_00189f58:
            local_148[0] = 0;
            pd._vptr_ParamDict = (_func_int **)0x0;
            pd.d._0_4_ = 0;
            pd.d._4_4_ = 0;
            uStack_174 = 0;
            local_170 = 0;
            local_168 = (Allocator *)0x0;
            iStack_160 = 0;
            iStack_15c = 0;
            iStack_158 = 0;
            iStack_154 = 0;
            local_150[0] = 0;
            uVar43 = 0;
            Mat::create((Mat *)&pd,0x24,iVar37,uVar35,4,(Allocator *)0x0);
            uVar25 = 0;
            if (0 < iVar37) {
              uVar25 = uVar26 & 0xffffffff;
            }
            uVar26 = 0;
            if (0 < (int)uVar35) {
              uVar26 = (ulong)uVar35;
            }
            for (; uVar43 != uVar26; uVar43 = uVar43 + 1) {
              lVar36 = (long)(iVar37 * 9 * (int)uVar43) * 4 +
                       *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
              pp_Var40 = (_func_int **)
                         (((ulong)uStack_174 << 0x20) * local_148[0] * uVar43 +
                         (long)pd._vptr_ParamDict);
              for (uVar41 = 0; uVar41 != uVar25; uVar41 = uVar41 + 1) {
                lVar29 = uVar41 * 0x24;
                fVar2 = *(float *)(lVar36 + 0x18 + lVar29);
                fVar3 = *(float *)(lVar36 + 0x1c + lVar29);
                fVar4 = *(float *)(lVar36 + 0x20 + lVar29);
                fVar5 = *(float *)(lVar36 + 0x10 + lVar29);
                fVar6 = *(float *)(lVar36 + lVar29);
                fVar7 = *(float *)(lVar36 + 4 + lVar29);
                fVar8 = *(float *)(lVar36 + 8 + lVar29);
                fVar9 = *(float *)(lVar36 + 0xc + lVar29);
                fVar10 = *(float *)(lVar36 + 0x14 + lVar29);
                for (lVar29 = 8; lVar29 != 0x50; lVar29 = lVar29 + 0xc) {
                  fVar11 = *(float *)((long)&DAT_004c66c0 + lVar29);
                  fVar55 = (float)*(undefined8 *)(&UNK_004c66b8 + lVar29);
                  fVar56 = (float)((ulong)*(undefined8 *)(&UNK_004c66b8 + lVar29) >> 0x20);
                  *(ulong *)((long)&local_f0 + lVar29) =
                       CONCAT44(fVar11 * fVar10 + fVar56 * fVar5 + fVar55 * fVar9,
                                fVar11 * fVar8 + fVar55 * fVar6 + fVar56 * fVar7);
                  *(float *)((long)&pd_5._vptr_ParamDict + lVar29) =
                       fVar11 * fVar4 + fVar55 * fVar2 + fVar56 * fVar3;
                }
                pp_Var44 = pp_Var40;
                for (lVar29 = 0; lVar29 != 6; lVar29 = lVar29 + 1) {
                  fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc);
                  uVar18 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc + 4);
                  puVar30 = &DAT_004c66c4;
                  for (lVar45 = 0; lVar45 != 6; lVar45 = lVar45 + 1) {
                    *(float *)((long)pp_Var44 + lVar45 * 4) =
                         (float)((ulong)*puVar30 >> 0x20) * (float)((ulong)uVar18 >> 0x20) +
                         *(float *)((long)puVar30 + -4) * fVar2 + (float)*puVar30 * (float)uVar18;
                    puVar30 = (undefined8 *)((long)puVar30 + 0xc);
                  }
                  pp_Var44 = pp_Var44 + 3;
                }
                pp_Var40 = (_func_int **)
                           ((long)pp_Var40 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
              }
            }
            Mat::create(&this->weight_winograd43_data,(int)local_190 << 3,0x24,
                        (int)uVar35 / 8 + (int)uVar35 % 4 +
                        (int)(char)((char)((long)(int)uVar35 % 8) / '\x04'),4,(Allocator *)0x0);
            iVar32 = (this->weight_winograd43_data).w;
            pvVar15 = (this->weight_winograd43_data).data;
            sVar16 = (this->weight_winograd43_data).elemsize;
            sVar17 = (this->weight_winograd43_data).cstep;
            for (uVar43 = 0; (long)(uVar43 | 7) < lVar33; uVar43 = uVar43 + 8) {
              lVar36 = 0;
              for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
                lVar42 = (long)pvVar15 +
                         (long)iVar32 * sVar16 * lVar29 + (uVar43 >> 3) * sVar17 * sVar16;
                lVar45 = ((ulong)uStack_174 << 0x20) * local_148[0];
                puVar50 = (undefined4 *)(lVar45 * uVar43 + lVar36 + (long)pd._vptr_ParamDict);
                for (uVar26 = 0; uVar26 != uVar25; uVar26 = uVar26 + 1) {
                  puVar34 = puVar50;
                  for (lVar47 = 0; lVar47 != 0x20; lVar47 = lVar47 + 4) {
                    *(undefined4 *)(lVar42 + lVar47) = *puVar34;
                    puVar34 = (undefined4 *)((long)puVar34 + lVar45);
                  }
                  puVar50 = (undefined4 *)
                            ((long)puVar50 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
                  lVar42 = lVar42 + 0x20;
                }
                lVar36 = lVar36 + 4;
              }
            }
            iVar32 = (this->weight_winograd43_data).w;
            pvVar15 = (this->weight_winograd43_data).data;
            sVar16 = (this->weight_winograd43_data).elemsize;
            sVar17 = (this->weight_winograd43_data).cstep;
            for (; (long)(uVar43 | 3) < lVar33; uVar43 = uVar43 + 4) {
              lVar36 = 0;
              for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
                lVar42 = (long)pvVar15 +
                         (long)iVar32 * sVar16 * lVar29 +
                         (ulong)(((uint)(uVar43 >> 3) & 0x1fffffff) +
                                (uint)(((uint)uVar43 >> 2 & 1) != 0)) * sVar17 * sVar16;
                lVar45 = ((ulong)uStack_174 << 0x20) * local_148[0];
                puVar50 = (undefined4 *)(lVar45 * uVar43 + lVar36 + (long)pd._vptr_ParamDict);
                for (uVar26 = 0; uVar26 != uVar25; uVar26 = uVar26 + 1) {
                  puVar34 = puVar50;
                  for (lVar47 = 0; lVar47 != 0x10; lVar47 = lVar47 + 4) {
                    *(undefined4 *)(lVar42 + lVar47) = *puVar34;
                    puVar34 = (undefined4 *)((long)puVar34 + lVar45);
                  }
                  puVar50 = (undefined4 *)
                            ((long)puVar50 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
                  lVar42 = lVar42 + 0x10;
                }
                lVar36 = lVar36 + 4;
              }
            }
            iVar32 = (this->weight_winograd43_data).w;
            pvVar15 = (this->weight_winograd43_data).data;
            sVar16 = (this->weight_winograd43_data).elemsize;
            sVar17 = (this->weight_winograd43_data).cstep;
            uVar26 = uVar43 & 0xffffffff;
            while( true ) {
              uVar35 = (uint)uVar26;
              if (lVar33 <= (long)uVar43) break;
              pvVar38 = (void *)((ulong)((uVar35 & 3) + (int)(uVar26 >> 3) +
                                        (uint)((uVar35 >> 2 & 1) != 0)) * sVar16 * sVar17 +
                                (long)pvVar15);
              lVar36 = 0;
              for (lVar29 = 0; lVar29 != 0x24; lVar29 = lVar29 + 1) {
                puVar50 = (undefined4 *)
                          (local_148[0] * uVar43 * ((ulong)uStack_174 << 0x20) + lVar36 +
                          (long)pd._vptr_ParamDict);
                for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
                  *(undefined4 *)((long)pvVar38 + uVar26 * 4) = *puVar50;
                  puVar50 = (undefined4 *)
                            ((long)puVar50 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
                }
                lVar36 = lVar36 + 4;
                pvVar38 = (void *)((long)pvVar38 + (long)iVar32 * sVar16);
              }
              uVar43 = uVar43 + 1;
              uVar26 = (ulong)(uVar35 + 1);
            }
            piVar13 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
            if (piVar13 == (int *)0x0) goto LAB_0018a29d;
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 != 0) goto LAB_0018a29d;
            if (local_168 != (Allocator *)0x0) {
              (*local_168->_vptr_Allocator[3])();
              goto LAB_0018a29d;
            }
          }
          else {
            if (bVar12 == false) goto LAB_00189f58;
LAB_0018a843:
            local_148[0] = 0;
            pd._vptr_ParamDict = (_func_int **)0x0;
            pd.d._0_4_ = 0;
            pd.d._4_4_ = 0;
            uStack_174 = 0;
            local_170 = 0;
            local_168 = (Allocator *)0x0;
            iStack_160 = 0;
            iStack_15c = 0;
            iStack_158 = 0;
            iStack_154 = 0;
            local_150[0] = 0;
            uVar43 = 0;
            Mat::create((Mat *)&pd,0x10,iVar37,uVar35,4,(Allocator *)0x0);
            uVar25 = 0;
            if (0 < iVar37) {
              uVar25 = uVar26 & 0xffffffff;
            }
            uVar26 = 0;
            if (0 < (int)uVar35) {
              uVar26 = (ulong)uVar35;
            }
            for (; uVar43 != uVar26; uVar43 = uVar43 + 1) {
              lVar36 = (long)(iVar37 * 9 * (int)uVar43) * 4 +
                       *(long *)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
              pp_Var40 = (_func_int **)
                         (((ulong)uStack_174 << 0x20) * local_148[0] * uVar43 +
                         (long)pd._vptr_ParamDict);
              for (uVar41 = 0; uVar41 != uVar25; uVar41 = uVar41 + 1) {
                lVar29 = uVar41 * 0x24;
                fVar2 = *(float *)(lVar36 + 0x18 + lVar29);
                fVar3 = *(float *)(lVar36 + 0x1c + lVar29);
                fVar4 = *(float *)(lVar36 + 0x20 + lVar29);
                fVar5 = *(float *)(lVar36 + 0x10 + lVar29);
                fVar6 = *(float *)(lVar36 + lVar29);
                fVar7 = *(float *)(lVar36 + 4 + lVar29);
                fVar8 = *(float *)(lVar36 + 8 + lVar29);
                fVar9 = *(float *)(lVar36 + 0xc + lVar29);
                fVar10 = *(float *)(lVar36 + 0x14 + lVar29);
                for (lVar29 = 8; lVar29 != 0x38; lVar29 = lVar29 + 0xc) {
                  fVar11 = *(float *)((long)&DAT_004c6710 + lVar29);
                  fVar55 = (float)*(undefined8 *)(&UNK_004c6708 + lVar29);
                  fVar56 = (float)((ulong)*(undefined8 *)(&UNK_004c6708 + lVar29) >> 0x20);
                  *(ulong *)((long)&local_f0 + lVar29) =
                       CONCAT44(fVar11 * fVar10 + fVar56 * fVar5 + fVar55 * fVar9,
                                fVar11 * fVar8 + fVar55 * fVar6 + fVar56 * fVar7);
                  *(float *)((long)&pd_5._vptr_ParamDict + lVar29) =
                       fVar11 * fVar4 + fVar55 * fVar2 + fVar56 * fVar3;
                }
                pp_Var44 = pp_Var40;
                for (lVar29 = 0; lVar29 != 4; lVar29 = lVar29 + 1) {
                  fVar2 = *(float *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc);
                  uVar18 = *(undefined8 *)((long)&pd_5._vptr_ParamDict + lVar29 * 0xc + 4);
                  puVar30 = &DAT_004c6714;
                  for (lVar45 = 0; lVar45 != 4; lVar45 = lVar45 + 1) {
                    *(float *)((long)pp_Var44 + lVar45 * 4) =
                         (float)((ulong)*puVar30 >> 0x20) * (float)((ulong)uVar18 >> 0x20) +
                         *(float *)((long)puVar30 + -4) * fVar2 + (float)*puVar30 * (float)uVar18;
                    puVar30 = (undefined8 *)((long)puVar30 + 0xc);
                  }
                  pp_Var44 = pp_Var44 + 2;
                }
                pp_Var40 = (_func_int **)
                           ((long)pp_Var40 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
              }
            }
            Mat::create(&this->weight_winograd23_data,(int)local_190 << 3,0x10,
                        (int)uVar35 / 8 + (int)uVar35 % 4 +
                        (int)(char)((char)((long)(int)uVar35 % 8) / '\x04'),4,(Allocator *)0x0);
            iVar32 = (this->weight_winograd23_data).w;
            pvVar15 = (this->weight_winograd23_data).data;
            sVar16 = (this->weight_winograd23_data).elemsize;
            sVar17 = (this->weight_winograd23_data).cstep;
            for (uVar43 = 0; (long)(uVar43 | 7) < lVar33; uVar43 = uVar43 + 8) {
              lVar36 = 0;
              for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
                lVar42 = (long)pvVar15 +
                         (long)iVar32 * sVar16 * lVar29 + (uVar43 >> 3) * sVar17 * sVar16;
                lVar45 = ((ulong)uStack_174 << 0x20) * local_148[0];
                puVar50 = (undefined4 *)(lVar45 * uVar43 + lVar36 + (long)pd._vptr_ParamDict);
                for (uVar26 = 0; uVar26 != uVar25; uVar26 = uVar26 + 1) {
                  puVar34 = puVar50;
                  for (lVar47 = 0; lVar47 != 0x20; lVar47 = lVar47 + 4) {
                    *(undefined4 *)(lVar42 + lVar47) = *puVar34;
                    puVar34 = (undefined4 *)((long)puVar34 + lVar45);
                  }
                  puVar50 = (undefined4 *)
                            ((long)puVar50 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
                  lVar42 = lVar42 + 0x20;
                }
                lVar36 = lVar36 + 4;
              }
            }
            iVar32 = (this->weight_winograd23_data).w;
            pvVar15 = (this->weight_winograd23_data).data;
            sVar16 = (this->weight_winograd23_data).elemsize;
            sVar17 = (this->weight_winograd23_data).cstep;
            for (; (long)(uVar43 | 3) < lVar33; uVar43 = uVar43 + 4) {
              lVar36 = 0;
              for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
                lVar42 = (long)pvVar15 +
                         (long)iVar32 * sVar16 * lVar29 +
                         (ulong)(((uint)(uVar43 >> 3) & 0x1fffffff) +
                                (uint)(((uint)uVar43 >> 2 & 1) != 0)) * sVar17 * sVar16;
                lVar45 = ((ulong)uStack_174 << 0x20) * local_148[0];
                puVar50 = (undefined4 *)(lVar45 * uVar43 + lVar36 + (long)pd._vptr_ParamDict);
                for (uVar26 = 0; uVar26 != uVar25; uVar26 = uVar26 + 1) {
                  puVar34 = puVar50;
                  for (lVar47 = 0; lVar47 != 0x10; lVar47 = lVar47 + 4) {
                    *(undefined4 *)(lVar42 + lVar47) = *puVar34;
                    puVar34 = (undefined4 *)((long)puVar34 + lVar45);
                  }
                  puVar50 = (undefined4 *)
                            ((long)puVar50 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
                  lVar42 = lVar42 + 0x10;
                }
                lVar36 = lVar36 + 4;
              }
            }
            iVar32 = (this->weight_winograd23_data).w;
            pvVar15 = (this->weight_winograd23_data).data;
            sVar16 = (this->weight_winograd23_data).elemsize;
            sVar17 = (this->weight_winograd23_data).cstep;
            uVar26 = uVar43 & 0xffffffff;
            while( true ) {
              uVar35 = (uint)uVar26;
              if (lVar33 <= (long)uVar43) break;
              pvVar38 = (void *)((ulong)((uVar35 & 3) + (int)(uVar26 >> 3) +
                                        (uint)((uVar35 >> 2 & 1) != 0)) * sVar16 * sVar17 +
                                (long)pvVar15);
              lVar36 = 0;
              for (lVar29 = 0; lVar29 != 0x10; lVar29 = lVar29 + 1) {
                puVar50 = (undefined4 *)
                          (local_148[0] * uVar43 * ((ulong)uStack_174 << 0x20) + lVar36 +
                          (long)pd._vptr_ParamDict);
                for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
                  *(undefined4 *)((long)pvVar38 + uVar26 * 4) = *puVar50;
                  puVar50 = (undefined4 *)
                            ((long)puVar50 + (long)iStack_15c * ((ulong)uStack_174 << 0x20));
                }
                lVar36 = lVar36 + 4;
                pvVar38 = (void *)((long)pvVar38 + (long)iVar32 * sVar16);
              }
              uVar43 = uVar43 + 1;
              uVar26 = (ulong)(uVar35 + 1);
            }
            piVar13 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
            if (piVar13 == (int *)0x0) goto LAB_0018a29d;
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 != 0) goto LAB_0018a29d;
            if (local_168 != (Allocator *)0x0) {
              (*local_168->_vptr_Allocator[3])();
              goto LAB_0018a29d;
            }
          }
          free(pd._vptr_ParamDict);
          goto LAB_0018a29d;
        }
      }
    }
    if (opt->use_sgemm_convolution != true) {
      if (p_Var51 != (_func_int *)0xfffffffffffffeb0) {
        piVar13 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var51);
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + 1;
          UNLOCK();
        }
        piVar13 = (this->weight_data_tm).refcount;
        if (piVar13 != (int *)0x0) {
          LOCK();
          *piVar13 = *piVar13 + -1;
          UNLOCK();
          if (*piVar13 == 0) {
            pAVar14 = (this->weight_data_tm).allocator;
            if (pAVar14 == (Allocator *)0x0) {
              free((this->weight_data_tm).data);
            }
            else {
              (*pAVar14->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).c = 0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        p_Var1 = (_func_int *)((long)&(this->weight_winograd63_data).h + (long)p_Var51);
        piVar13 = *(int **)(p_Var1 + 8);
        (this->weight_data_tm).data = *(void **)p_Var1;
        (this->weight_data_tm).refcount = piVar13;
        (this->weight_data_tm).elemsize =
             *(size_t *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var51);
        (this->weight_data_tm).elempack =
             *(int *)((long)&this->convolution_dilation1 + (long)p_Var51);
        (this->weight_data_tm).allocator =
             *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var51);
        p_Var1 = (_func_int *)((long)&(this->scale_in_data).refcount + (long)p_Var51);
        uVar18 = *(undefined8 *)p_Var1;
        uVar20 = *(undefined8 *)(p_Var1 + 8);
        (this->weight_data_tm).dims = (int)uVar18;
        (this->weight_data_tm).w = (int)((ulong)uVar18 >> 0x20);
        (this->weight_data_tm).h = (int)uVar20;
        (this->weight_data_tm).d = (int)((ulong)uVar20 >> 0x20);
        (this->weight_data_tm).c = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var51);
        (this->weight_data_tm).cstep =
             *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var51);
      }
      goto LAB_0018a29d;
    }
    iVar24 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var51);
    iVar39 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var51);
  }
  convolution_im2col_sgemm_transform_kernel_sse
            ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var51),
             &this->weight_sgemm_data,iVar37,iVar24,iVar32,iVar39);
LAB_0018a29d:
  if (opt->lightmode == true) {
    p_Var51 = this->_vptr_Convolution_x86[-3];
    piVar13 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var51);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        plVar19 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var51);
        if (plVar19 == (long *)0x0) {
          free(*(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var51));
        }
        else {
          (**(code **)(*plVar19 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var51) = 0;
    *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var51) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var51 + 4)) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var51) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var51) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var51) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var51) = 0;
    *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var51) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}